

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_fp_load(DisasContext_conflict11 *ctx,uint32_t opc,int rd,int rs1,target_long_conflict imm)

{
  TCGContext_conflict9 *tcg_ctx_00;
  _Bool _Var1;
  TCGv_i32 t;
  TCGv_i32 t0;
  TCGContext_conflict9 *tcg_ctx;
  target_long_conflict imm_local;
  int rs1_local;
  int rd_local;
  uint32_t opc_local;
  DisasContext_conflict11 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (ctx->mstatus_fs == 0) {
    gen_exception_illegal(ctx);
    return;
  }
  t = tcg_temp_new_i32(tcg_ctx_00);
  gen_get_gpr(tcg_ctx_00,t,rs1);
  tcg_gen_addi_i32_riscv32(tcg_ctx_00,t,t,imm);
  if (opc == 0x2007) {
    _Var1 = has_ext(ctx,0x20);
    if (_Var1) {
      tcg_gen_qemu_ld_i64_riscv32(tcg_ctx_00,tcg_ctx_00->cpu_fpr[rd],t,(ulong)ctx->mem_idx,MO_32);
      tcg_gen_ori_i64_riscv32
                (tcg_ctx_00,tcg_ctx_00->cpu_fpr[rd],tcg_ctx_00->cpu_fpr[rd],-0x100000000);
      goto LAB_011404e7;
    }
  }
  else if ((opc == 0x3007) && (_Var1 = has_ext(ctx,8), _Var1)) {
    tcg_gen_qemu_ld_i64_riscv32(tcg_ctx_00,tcg_ctx_00->cpu_fpr[rd],t,(ulong)ctx->mem_idx,MO_64);
    goto LAB_011404e7;
  }
  gen_exception_illegal(ctx);
LAB_011404e7:
  tcg_temp_free_i32(tcg_ctx_00,t);
  mark_fs_dirty(ctx);
  return;
}

Assistant:

static void gen_fp_load(DisasContext *ctx, uint32_t opc, int rd,
        int rs1, target_long imm)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;

    if (ctx->mstatus_fs == 0) {
        gen_exception_illegal(ctx);
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);
    gen_get_gpr(tcg_ctx, t0, rs1);
    tcg_gen_addi_tl(tcg_ctx, t0, t0, imm);

    switch (opc) {
    case OPC_RISC_FLW:
        if (!has_ext(ctx, RVF)) {
            goto do_illegal;
        }
        tcg_gen_qemu_ld_i64(tcg_ctx, tcg_ctx->cpu_fpr[rd], t0, ctx->mem_idx, MO_TEUL);
        /* RISC-V requires NaN-boxing of narrower width floating point values */
        tcg_gen_ori_i64(tcg_ctx, tcg_ctx->cpu_fpr[rd], tcg_ctx->cpu_fpr[rd], 0xffffffff00000000ULL);
        break;
    case OPC_RISC_FLD:
        if (!has_ext(ctx, RVD)) {
            goto do_illegal;
        }
        tcg_gen_qemu_ld_i64(tcg_ctx, tcg_ctx->cpu_fpr[rd], t0, ctx->mem_idx, MO_TEQ);
        break;
    do_illegal:
    default:
        gen_exception_illegal(ctx);
        break;
    }
    tcg_temp_free(tcg_ctx, t0);

    mark_fs_dirty(ctx);
}